

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_hard.cpp
# Opt level: O0

void anon_unknown.dwarf_cb25c::cross_off
               (BitSieve *sieve,int64_t low,int64_t high,int64_t prime,WheelItem *w)

{
  uint64_t pos;
  int64_t iVar1;
  long in_RCX;
  long in_RDX;
  WheelItem *in_R8;
  int64_t wheel_index;
  int64_t m;
  BitSieve *this;
  
  pos = (uint64_t)in_R8->wheel_index;
  for (this = (BitSieve *)in_R8->next_multiple; (long)this < in_RDX;
      this = (BitSieve *)
             ((long)&(this->sieve_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + in_RCX * iVar1)) {
    primesum::BitSieve::unset(this,pos);
    iVar1 = primesum::Wheel::next_multiple_factor((int64_t *)&stack0xffffffffffffffc8);
  }
  primesum::WheelItem::set(in_R8,(int64_t)this,pos);
  return;
}

Assistant:

int128_t cross_off(BitSieve& sieve,
                   int64_t low,
                   int64_t high,
                   int64_t prime,
                   WheelItem& w)
{
  int64_t m = w.next_multiple;
  int64_t wheel_index = w.wheel_index;
  int128_t sum = 0;

  for (; m < high; m += prime * Wheel::next_multiple_factor(&wheel_index))
  {
    sum += m * sieve[m - low];
    sieve.unset(m - low);
  }

  w.set(m, wheel_index);
  return sum;
}